

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  char **this_00;
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_01 [8];
  long lVar2;
  element_type *peVar3;
  long lVar4;
  size_type sVar5;
  Address AVar6;
  bool bVar7;
  Name NVar8;
  undefined1 local_178 [8];
  Flow dest;
  Flow offset;
  Flow size;
  undefined1 local_88 [8];
  Literal addr;
  undefined1 local_68 [8];
  MemoryInstanceInfo info;
  long local_38;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_178,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        NVar8.super_IString.str._M_str = (char *)(curr->segment).super_IString.str._M_len;
        NVar8.super_IString.str._M_len = (size_t)this->wasm;
        lVar2 = wasm::Module::getDataSegment(NVar8);
        addr.type.id = (uintptr_t)__return_storage_ptr__;
        Flow::getSingleValue((Flow *)local_178);
        peVar3 = (element_type *)wasm::Literal::getUnsigned();
        Flow::getSingleValue((Flow *)&dest.breakTo.super_IString.str._M_str);
        lVar4 = wasm::Literal::getUnsigned();
        Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
        local_38 = wasm::Literal::getUnsigned();
        if (lVar4 + local_38 != 0) {
          sVar5 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedDataSegments)._M_h,&curr->segment);
          if (sVar5 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        if ((ulong)(*(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38)) < (ulong)(lVar4 + local_38))
        {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_68,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        info.name.super_IString.str._M_str =
             (char *)getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_68,memory);
        if ((ulong)((long)info.name.super_IString.str._M_str << 0x10) <
            (ulong)((long)(peVar3->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems +
                   local_38 + -0x10)) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        this_00 = &size.breakTo.super_IString.str._M_str;
        while( true ) {
          this_01 = local_68;
          bVar7 = local_38 == 0;
          local_38 = local_38 + -1;
          if (bVar7) break;
          addr.field_0.func.super_IString.str._M_str = (char *)0x3;
          pEVar1 = *(ExternalInterface **)((long)local_68 + 0x200);
          local_88 = (undefined1  [8])peVar3;
          wasm::Literal::Literal((Literal *)this_00,(Literal *)local_88);
          AVar6 = getFinalAddressWithoutOffset
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)this_01,(Literal *)this_00,1,
                             (Address)info.name.super_IString.str._M_str);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar6.addr,(ulong)(uint)(int)*(char *)(*(long *)(lVar2 + 0x38) + lVar4),
                     info.instance,info.name.super_IString.str._M_len);
          wasm::Literal::~Literal((Literal *)this_00);
          wasm::Literal::~Literal((Literal *)local_88);
          lVar4 = lVar4 + 1;
          peVar3 = (element_type *)((long)&(peVar3->type).id + 1);
        }
        *(undefined8 *)(addr.type.id + 0x30) = 0;
        *(undefined8 *)(addr.type.id + 0x38) = 0;
        *(undefined8 *)(addr.type.id + 0x20) = 0;
        *(undefined8 *)(addr.type.id + 0x28) = 0;
        *(undefined8 *)(addr.type.id + 0x10) = 0;
        *(undefined8 *)(addr.type.id + 0x18) = 0;
        *(undefined8 *)addr.type.id = 0;
        *(undefined8 *)(addr.type.id + 8) = 0;
        *(undefined8 *)(addr.type.id + 0x40) = 0;
        __return_storage_ptr__ = (Flow *)addr.type.id;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&dest.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&dest.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_178);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_178);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(offset.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    if (offsetVal + sizeVal > 0 && droppedDataSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.interface()->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }